

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O1

bool __thiscall
units::uncertain_measurement::operator==(uncertain_measurement *this,measurement *other)

{
  float fVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  float fVar6;
  float fVar7;
  
  dVar5 = measurement::value_as(other,&this->units_);
  fVar6 = (float)dVar5;
  fVar1 = this->value_;
  fVar7 = this->uncertainty_;
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    bVar2 = fVar6 <= fVar7 + fVar1 && fVar1 - fVar7 <= fVar6;
  }
  else {
    bVar2 = true;
    if ((fVar1 != fVar6) || (NAN(fVar1) || NAN(fVar6))) {
      fVar7 = fVar1 - fVar6;
      if (((fVar7 != 0.0) || (NAN(fVar7))) && ((NAN(fVar7) || (0x7ffffe < (int)ABS(fVar7) - 1U)))) {
        fVar7 = (float)((int)fVar1 + 8U & 0xfffffff0);
        fVar3 = (float)((int)fVar6 + 8U & 0xfffffff0);
        if ((fVar7 != fVar3) || (NAN(fVar7) || NAN(fVar3))) {
          fVar4 = (float)((int)(fVar6 * 1.0000005) + 8U & 0xfffffff0);
          if ((fVar4 != fVar7) || (NAN(fVar4) || NAN(fVar7))) {
            fVar6 = (float)((int)(fVar6 * 0.9999995) + 8U & 0xfffffff0);
            if ((fVar6 != fVar7) || (NAN(fVar6) || NAN(fVar7))) {
              fVar7 = (float)((int)(fVar1 * 1.0000005) + 8U & 0xfffffff0);
              if ((fVar7 != fVar3) || (NAN(fVar7) || NAN(fVar3))) {
                bVar2 = (float)((int)(fVar1 * 0.9999995) + 8U & 0xfffffff0) == fVar3;
              }
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool operator==(const measurement& other) const
    {
        auto val = static_cast<float>(other.value_as(units_));
        if (uncertainty_ == 0.0F) {
            return (value_ == val) ? true :
                                     detail::compare_round_equals(value_, val);
        }
        return (
            val >= (value_ - uncertainty_) && val <= (value_ + uncertainty_));
    }